

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_CMap_Done(FT_CMap_conflict cmap)

{
  uint uVar1;
  int iVar2;
  FT_Face pFVar3;
  FT_CharMap pFVar4;
  ulong uVar5;
  FT_CharMap *ppFVar6;
  long cur_count;
  FT_CharMap pFVar7;
  ulong uVar8;
  FT_Error error;
  
  if (cmap != (FT_CMap_conflict)0x0) {
    pFVar3 = (cmap->charmap).face;
    uVar1 = pFVar3->num_charmaps;
    cur_count = (long)(int)uVar1;
    uVar8 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      ppFVar6 = pFVar3->charmaps;
      if ((FT_CMap_conflict)ppFVar6[uVar8] == cmap) {
        pFVar4 = ppFVar6[cur_count + -1];
        ppFVar6 = (FT_CharMap *)
                  ft_mem_qrealloc(pFVar3->memory,8,cur_count,cur_count + -1,ppFVar6,&error);
        pFVar3->charmaps = ppFVar6;
        if (error != 0) {
          return;
        }
        iVar2 = pFVar3->num_charmaps;
        for (; (int)uVar8 + 1 < iVar2; uVar8 = uVar8 + 1) {
          uVar5 = (ulong)(iVar2 - 2);
          pFVar7 = pFVar4;
          if (iVar2 - 2 != uVar8) {
            pFVar7 = pFVar3->charmaps[uVar8 + 1];
            uVar5 = uVar8;
          }
          pFVar3->charmaps[uVar5] = pFVar7;
        }
        pFVar3->num_charmaps = iVar2 + -1;
        if ((FT_CMap_conflict)pFVar3->charmap == cmap) {
          pFVar3->charmap = (FT_CharMap)0x0;
        }
        ft_cmap_done_internal(cmap);
        return;
      }
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_CMap_Done( FT_CMap  cmap )
  {
    if ( cmap )
    {
      FT_Face    face   = cmap->charmap.face;
      FT_Memory  memory = FT_FACE_MEMORY( face );
      FT_Error   error;
      FT_Int     i, j;


      for ( i = 0; i < face->num_charmaps; i++ )
      {
        if ( (FT_CMap)face->charmaps[i] == cmap )
        {
          FT_CharMap  last_charmap = face->charmaps[face->num_charmaps - 1];


          if ( FT_QRENEW_ARRAY( face->charmaps,
                                face->num_charmaps,
                                face->num_charmaps - 1 ) )
            return;

          /* remove it from our list of charmaps */
          for ( j = i + 1; j < face->num_charmaps; j++ )
          {
            if ( j == face->num_charmaps - 1 )
              face->charmaps[j - 1] = last_charmap;
            else
              face->charmaps[j - 1] = face->charmaps[j];
          }

          face->num_charmaps--;

          if ( (FT_CMap)face->charmap == cmap )
            face->charmap = NULL;

          ft_cmap_done_internal( cmap );

          break;
        }
      }
    }
  }